

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surjection_impl.h
# Opt level: O0

int secp256k1_surjection_genrand(secp256k1_scalar *s,size_t ns,secp256k1_scalar *blinding_key)

{
  int local_c4;
  undefined1 local_c0 [4];
  int overflow;
  secp256k1_sha256 sha256_en;
  uchar sec_input [36];
  size_t i;
  secp256k1_scalar *blinding_key_local;
  size_t ns_local;
  secp256k1_scalar *s_local;
  
  secp256k1_scalar_get_b32((uchar *)((long)&sha256_en.bytes + 4),blinding_key);
  stack0xffffffffffffffd0 = 0;
  while( true ) {
    if (ns <= stack0xffffffffffffffd0) {
      memset(&sha256_en.bytes,0,0x20);
      return 1;
    }
    local_c4 = 0;
    sha256_en.bytes._0_1_ = (undefined1)stack0xffffffffffffffd0;
    sha256_en.bytes._1_1_ = (undefined1)(stack0xffffffffffffffd0 >> 8);
    sha256_en.bytes._2_1_ = (undefined1)(stack0xffffffffffffffd0 >> 0x10);
    sha256_en.bytes._3_1_ = (undefined1)(stack0xffffffffffffffd0 >> 0x18);
    secp256k1_sha256_initialize((secp256k1_sha256 *)local_c0);
    secp256k1_sha256_write((secp256k1_sha256 *)local_c0,(uchar *)&sha256_en.bytes,0x24);
    secp256k1_sha256_finalize((secp256k1_sha256 *)local_c0,(uchar *)&sha256_en.bytes);
    secp256k1_scalar_set_b32(s + stack0xffffffffffffffd0,(uchar *)&sha256_en.bytes,&local_c4);
    if (local_c4 == 1) break;
    register0x00000000 = stack0xffffffffffffffd0 + 1;
  }
  memset(&sha256_en.bytes,0,0x20);
  return 0;
}

Assistant:

SECP256K1_INLINE static int secp256k1_surjection_genrand(secp256k1_scalar *s, size_t ns, const secp256k1_scalar *blinding_key) {
    size_t i;
    unsigned char sec_input[36];
    secp256k1_sha256 sha256_en;

    /* compute s values */
    secp256k1_scalar_get_b32(&sec_input[4], blinding_key);
    for (i = 0; i < ns; i++) {
        int overflow = 0;
        sec_input[0] = i;
        sec_input[1] = i >> 8;
        sec_input[2] = i >> 16;
        sec_input[3] = i >> 24;

        secp256k1_sha256_initialize(&sha256_en);
        secp256k1_sha256_write(&sha256_en, sec_input, 36);
        secp256k1_sha256_finalize(&sha256_en, sec_input);
        secp256k1_scalar_set_b32(&s[i], sec_input, &overflow);
        if (overflow == 1) {
            memset(sec_input, 0, 32);
            return 0;
        }
    }
    memset(sec_input, 0, 32);
    return 1;
}